

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URITest.cpp
# Opt level: O2

void __thiscall jaegertracing::net::URI_queryEscape_Test::TestBody(URI_queryEscape_Test *this)

{
  char *pcVar1;
  allocator local_59;
  AssertionResult gtest_ar;
  string local_48 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::__cxx11::string::string(local_48,"hello world",&local_59);
  jaegertracing::net::URI::queryEscape((string *)&local_28);
  testing::internal::CmpHelperEQ<char[14],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"hello%20world\"","URI::queryEscape(\"hello world\")",
             (char (*) [14])"hello%20world",&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string(local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
               ,0x37,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_48,(Message *)&local_28);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    std::__cxx11::string::string(local_48,"hello-world",&local_59);
    jaegertracing::net::URI::queryEscape((string *)&local_28);
    testing::internal::CmpHelperEQ<char[12],std::__cxx11::string>
              ((internal *)&gtest_ar,"\"hello-world\"","URI::queryEscape(\"hello-world\")",
               (char (*) [12])"hello-world",&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::~string(local_48);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_28);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                 ,0x38,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_48,(Message *)&local_28);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      std::__cxx11::string::string(local_48,"hello.world",&local_59);
      jaegertracing::net::URI::queryEscape((string *)&local_28);
      testing::internal::CmpHelperEQ<char[12],std::__cxx11::string>
                ((internal *)&gtest_ar,"\"hello.world\"","URI::queryEscape(\"hello.world\")",
                 (char (*) [12])"hello.world",&local_28);
      std::__cxx11::string::~string((string *)&local_28);
      std::__cxx11::string::~string(local_48);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_28);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_48,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                   ,0x39,pcVar1);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_48,(Message *)&local_28);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        std::__cxx11::string::string(local_48,"hello_world",&local_59);
        jaegertracing::net::URI::queryEscape((string *)&local_28);
        testing::internal::CmpHelperEQ<char[12],std::__cxx11::string>
                  ((internal *)&gtest_ar,"\"hello_world\"","URI::queryEscape(\"hello_world\")",
                   (char (*) [12])"hello_world",&local_28);
        std::__cxx11::string::~string((string *)&local_28);
        std::__cxx11::string::~string(local_48);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_28);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_48,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                     ,0x3a,pcVar1);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_48,(Message *)&local_28);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          std::__cxx11::string::string(local_48,"hello~world",&local_59);
          jaegertracing::net::URI::queryEscape((string *)&local_28);
          testing::internal::CmpHelperEQ<char[12],std::__cxx11::string>
                    ((internal *)&gtest_ar,"\"hello~world\"","URI::queryEscape(\"hello~world\")",
                     (char (*) [12])"hello~world",&local_28);
          std::__cxx11::string::~string((string *)&local_28);
          std::__cxx11::string::~string(local_48);
          if (gtest_ar.success_ != false) {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            std::__cxx11::string::string(local_48,"hello:world",&local_59);
            jaegertracing::net::URI::queryEscape((string *)&local_28);
            testing::internal::CmpHelperEQ<char[14],std::__cxx11::string>
                      ((internal *)&gtest_ar,"\"hello%3Aworld\"","URI::queryEscape(\"hello:world\")"
                       ,(char (*) [14])"hello%3Aworld",&local_28);
            std::__cxx11::string::~string((string *)&local_28);
            std::__cxx11::string::~string(local_48);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&local_28);
              if (gtest_ar.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar1 = "";
              }
              else {
                pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_48,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                         ,0x3c,pcVar1);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_48,(Message *)&local_28);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_48);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_28);
            }
            goto LAB_001ba8a9;
          }
          testing::Message::Message((Message *)&local_28);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_48,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                     ,0x3b,pcVar1);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_48,(Message *)&local_28);
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_48);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_28);
LAB_001ba8a9:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(URI, queryEscape)
{
    ASSERT_EQ("hello%20world", URI::queryEscape("hello world"));
    ASSERT_EQ("hello-world", URI::queryEscape("hello-world"));
    ASSERT_EQ("hello.world", URI::queryEscape("hello.world"));
    ASSERT_EQ("hello_world", URI::queryEscape("hello_world"));
    ASSERT_EQ("hello~world", URI::queryEscape("hello~world"));
    ASSERT_EQ("hello%3Aworld", URI::queryEscape("hello:world"));
}